

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_long>(ostream *out,char *fmt,unsigned_long *args)

{
  FormatListN<1> local_48;
  unsigned_long *local_20;
  unsigned_long *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_20 = args;
  args_local = (unsigned_long *)fmt;
  fmt_local = (char *)out;
  makeFormatList<unsigned_long>(&local_48,args);
  vformat(out,fmt,&local_48.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}